

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<unsigned_long> * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::
ValidateNumberConversion<unsigned_long,double>
          (StatusOr<unsigned_long> *__return_storage_ptr__,_anonymous_namespace_ *this,
          unsigned_long after,double before)

{
  char *pcVar1;
  undefined *in_RCX;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  StringPiece value_str;
  string local_70;
  undefined1 local_50 [40];
  _anonymous_namespace_ *local_28;
  unsigned_long after_local;
  
  auVar3._8_4_ = (int)((ulong)this >> 0x20);
  auVar3._0_8_ = this;
  auVar3._12_4_ = 0x45300000;
  dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0);
  local_28 = this;
  if ((dVar4 == before) && (!NAN(dVar4) && !NAN(before))) {
    dVar2 = 0.0;
    in_RCX = (undefined *)CONCAT71((int7)((ulong)in_RCX >> 8),0.0 < before);
    dVar4 = before;
    if (before != 0.0) {
      in_RCX = &DAT_0036c5b0;
      dVar4 = *(double *)(&DAT_0036c5b0 + (ulong)(0.0 < before) * 8);
    }
    if (this != (_anonymous_namespace_ *)0x0) {
      dVar2 = 1.0;
    }
    if ((dVar4 == dVar2) && (!NAN(dVar4) && !NAN(dVar2))) {
      StatusOr<unsigned_long>::StatusOr(__return_storage_ptr__,(unsigned_long *)&local_28);
      return __return_storage_ptr__;
    }
  }
  DoubleAsString_abi_cxx11_(&local_70,(converter *)this,before);
  pcVar1 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
  value_str.length_ = (stringpiece_ssize_type)in_RCX;
  value_str.ptr_ = pcVar1;
  anon_unknown_1::InvalidArgument
            ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str);
  StatusOr<unsigned_long>::StatusOr(__return_storage_ptr__,(Status *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> ValidateNumberConversion(To after, From before) {
  if (after == before &&
      MathUtil::Sign<From>(before) == MathUtil::Sign<To>(after)) {
    return after;
  } else {
    return InvalidArgument(std::is_integral<From>::value
                               ? ValueAsString(before)
                               : std::is_same<From, double>::value
                                     ? DoubleAsString(before)
                                     : FloatAsString(before));
  }
}